

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.h
# Opt level: O1

void __thiscall
Js::DeserializationCloner<Js::StreamReader>::ReadObjectPropertiesIntoObject
          (DeserializationCloner<Js::StreamReader> *this,RecyclableObject *m_obj)

{
  ScriptContext *this_00;
  scaposition_t src;
  char16 *propertyName;
  Engine *this_01;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  Var value;
  charcount_t len;
  
  this_00 = (this->
            super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
            ).super_ScriptContextHolder.m_scriptContext;
  while( true ) {
    value._4_4_ = 0;
    propertyName = TryReadString(this,(charcount_t *)((long)&value + 4),true);
    if (propertyName == (char16 *)0x0) {
      return;
    }
    ScriptContext::GetOrAddPropertyRecord(this_00,propertyName,value._4_4_,&local_48);
    this_01 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
              ::GetEngine(&this->
                           super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                         );
    src = StreamReader::GetPosition(this->m_reader);
    SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
              (this_01,src,&propertyRecord);
    if (propertyRecord == (PropertyRecord *)0x0) break;
    (*(m_obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x17])(m_obj,(ulong)(uint)local_48->pid,propertyRecord,0,0);
    if (propertyName == (char16 *)0x0) {
      return;
    }
  }
  ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
}

Assistant:

void ReadObjectPropertiesIntoObject(RecyclableObject* m_obj)
        {
            ScriptContext* scriptContext = this->GetScriptContext();

            for(;;)
            {
                charcount_t len = 0;
                const char16* name = TryReadString(&len, /*reuseBuffer*/ true);
                if (!name)
                {
                    break;
                }

                Js::PropertyRecord const * propertyRecord;
                scriptContext->GetOrAddPropertyRecord(name, len, &propertyRecord);

                // NOTE: 'Clone' may reenter here and use the buffer that backs the 'name'.
                //       That is ok, since we do not need it past this point.
                //       The propertyRecord keeps its own copy od the data.

                Var value;
                this->GetEngine()->Clone(m_reader->GetPosition(), &value);
                if (!value)
                {
                    this->ThrowSCADataCorrupt();
                }

                m_obj->SetProperty(propertyRecord->GetPropertyId(), value, PropertyOperation_None, NULL); //Note: no prototype check
            }
        }